

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Matrix * MatrixInverse(Matrix *a)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  Real *pRVar17;
  Matrix *pMVar18;
  uint32_t columns;
  Matrix *in_RSI;
  uint32_t rows;
  longdouble in_ST0;
  undefined1 auStack_d58 [8];
  Real new [1] [1];
  
  if ((a->rows == a->columns) && (0xfffffffa < a->rows - 6)) {
    pRVar17 = a->matrix;
    MatrixDeterminant((Real *)a,in_RSI);
    rows = a->rows;
    switch(rows) {
    case 1:
      _auStack_d58 = (longdouble)1 / in_ST0;
      columns = a->columns;
      rows = 1;
      break;
    case 2:
      _auStack_d58 = *(longdouble *)(pRVar17 + 3) / in_ST0;
      register0x00001100 = -*(longdouble *)(pRVar17 + 1) / in_ST0;
      columns = a->columns;
      rows = 2;
      break;
    case 3:
      _auStack_d58 = (*(longdouble *)(pRVar17 + 4) * *(longdouble *)(pRVar17 + 8) -
                     *(longdouble *)(pRVar17 + 5) * *(longdouble *)(pRVar17 + 7)) / in_ST0;
      register0x00001100 =
           (*(longdouble *)(pRVar17 + 7) * *(longdouble *)(pRVar17 + 2) -
           *(longdouble *)(pRVar17 + 8) * *(longdouble *)(pRVar17 + 1)) / in_ST0;
      columns = a->columns;
      rows = 3;
      break;
    case 4:
      lVar1 = *(longdouble *)(pRVar17 + 10);
      lVar2 = *(longdouble *)(pRVar17 + 0xd);
      lVar3 = *(longdouble *)(pRVar17 + 0xb);
      lVar4 = *(longdouble *)(pRVar17 + 9);
      lVar5 = *(longdouble *)(pRVar17 + 0xe);
      lVar6 = *(longdouble *)(pRVar17 + 0xf);
      _auStack_d58 = ((((*(longdouble *)(pRVar17 + 7) * lVar4 * lVar5 +
                        (*(longdouble *)(pRVar17 + 6) * lVar3 * lVar2 -
                        lVar1 * *(longdouble *)(pRVar17 + 7) * lVar2)) -
                       lVar3 * *(longdouble *)(pRVar17 + 5) * lVar5) -
                      *(longdouble *)(pRVar17 + 6) * lVar4 * lVar6) +
                     *(longdouble *)(pRVar17 + 5) * lVar1 * lVar6) / in_ST0;
      register0x00001110 =
           ((lVar4 * *(longdouble *)(pRVar17 + 2) * lVar6 +
            lVar3 * *(longdouble *)(pRVar17 + 1) * lVar5 +
            ((lVar2 * lVar1 * *(longdouble *)(pRVar17 + 3) -
             lVar3 * *(longdouble *)(pRVar17 + 2) * lVar2) -
            *(longdouble *)(pRVar17 + 3) * lVar4 * lVar5)) -
           lVar1 * *(longdouble *)(pRVar17 + 1) * lVar6) / in_ST0;
      rows = a->rows;
      columns = a->columns;
      break;
    default:
      lVar1 = *(longdouble *)(pRVar17 + 9);
      lVar2 = *(longdouble *)(pRVar17 + 0xd);
      lVar3 = *(longdouble *)(pRVar17 + 0x11);
      lVar4 = *(longdouble *)(pRVar17 + 0x15);
      lVar5 = *(longdouble *)(pRVar17 + 8);
      lVar6 = *(longdouble *)(pRVar17 + 0xe);
      lVar7 = *(longdouble *)(pRVar17 + 0xc);
      lVar8 = *(longdouble *)(pRVar17 + 0x12);
      lVar9 = *(longdouble *)(pRVar17 + 7);
      lVar10 = *(longdouble *)(pRVar17 + 0x13);
      lVar11 = *(longdouble *)(pRVar17 + 0x10);
      lVar12 = *(longdouble *)(pRVar17 + 0x16);
      lVar13 = *(longdouble *)(pRVar17 + 0xb);
      lVar14 = *(longdouble *)(pRVar17 + 6);
      lVar15 = *(longdouble *)(pRVar17 + 0x17);
      lVar16 = *(longdouble *)(pRVar17 + 0x18);
      _auStack_d58 = (lVar8 * lVar7 * lVar14 * lVar16 +
                     (((lVar5 * lVar13 * lVar3 * lVar16 +
                       lVar2 * lVar9 * lVar11 * lVar16 +
                       (((lVar13 * lVar9 * lVar10 * lVar15 +
                         lVar6 * lVar14 * lVar3 * lVar15 +
                         (((lVar1 * lVar7 * lVar11 * lVar15 +
                           lVar2 * lVar14 * lVar10 * lVar12 +
                           (((lVar1 * lVar13 * lVar8 * lVar12 +
                             lVar5 * lVar6 * lVar11 * lVar12 +
                             (((lVar5 * lVar7 * lVar10 * lVar4 +
                               ((lVar2 * lVar1 * lVar3 * lVar4 - lVar5 * lVar6 * lVar3 * lVar4) -
                               lVar1 * lVar7 * lVar8 * lVar4) + lVar8 * lVar6 * lVar9 * lVar4) -
                              lVar4 * lVar10 * lVar2 * lVar9) - lVar2 * lVar1 * lVar11 * lVar12)) -
                            lVar6 * lVar14 * lVar8 * lVar12) - lVar5 * lVar13 * lVar10 * lVar12)) -
                          lVar6 * lVar9 * lVar11 * lVar15) - lVar1 * lVar13 * lVar3 * lVar15)) -
                        lVar10 * lVar7 * lVar14 * lVar15) - lVar5 * lVar7 * lVar11 * lVar16)) -
                      lVar2 * lVar14 * lVar3 * lVar16) - lVar13 * lVar9 * lVar8 * lVar16)) / in_ST0;
      lVar1 = *(longdouble *)(pRVar17 + 4);
      lVar5 = *(longdouble *)(pRVar17 + 3);
      lVar9 = *(longdouble *)(pRVar17 + 2);
      lVar14 = *(longdouble *)(pRVar17 + 1);
      register0x00001110 =
           ((lVar9 * lVar13 * lVar8 * lVar16 +
            lVar2 * lVar14 * lVar3 * lVar16 +
            (((lVar7 * lVar5 * lVar11 * lVar16 +
              lVar10 * lVar14 * lVar7 * lVar15 +
              (((lVar1 * lVar13 * lVar3 * lVar15 +
                lVar6 * lVar9 * lVar11 * lVar15 +
                (((lVar5 * lVar13 * lVar10 * lVar12 +
                  lVar6 * lVar14 * lVar8 * lVar12 +
                  (((lVar2 * lVar1 * lVar11 * lVar12 +
                    lVar10 * lVar9 * lVar2 * lVar4 +
                    (((lVar3 * lVar2 * -lVar1 * lVar4 + lVar6 * lVar5 * lVar3 * lVar4 +
                      lVar1 * lVar7 * lVar8 * lVar4) - lVar8 * lVar6 * lVar9 * lVar4) -
                    lVar7 * lVar5 * lVar10 * lVar4)) - lVar6 * lVar5 * lVar11 * lVar12) -
                  lVar1 * lVar13 * lVar8 * lVar12)) - lVar2 * lVar14 * lVar10 * lVar12) -
                lVar1 * lVar7 * lVar11 * lVar15)) - lVar6 * lVar14 * lVar3 * lVar15) -
              lVar10 * lVar9 * lVar13 * lVar15)) - lVar9 * lVar2 * lVar11 * lVar16) -
            lVar5 * lVar13 * lVar3 * lVar16)) - lVar14 * lVar7 * lVar8 * lVar16) / in_ST0;
      columns = a->columns;
    }
    pMVar18 = MatrixFromArray(rows,columns,auStack_d58);
  }
  else {
    pMVar18 = (Matrix *)0x0;
    fprintf(_stderr,"%s: Unsupported dimension (%dx%d)\n","MatrixInverse");
  }
  return pMVar18;
}

Assistant:

Matrix *MatrixInverse(const Matrix *a) {
#ifndef NDEBUG
  if (a->rows != a->columns || a->rows == 0 || a->rows > 5) {
    fprintf(stderr, "%s: Unsupported dimension (%dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns);
    return NULL;
  }
#endif
  Real *m = a->matrix;
  Real d = MatrixDeterminant(a);
  if (a->rows == 1) {
    Real new[][1] = {{1 / d}};
    return MatrixFromArray(a->rows, a->columns, new);
  } else if (a->rows == 2) {
    Real new[][2] = {{m[3] / d, -m[1] / d}, {-m[2] / d, m[0] / d}};
    return MatrixFromArray(a->rows, a->columns, new);
  } else if (a->rows == 3) {
    Real new[][3] = {{(-m[5] * m[7] + m[4] * m[8]) / d, (m[2] * m[7] - m[1] * m[8]) / d, (-m[2] * m[4] + m[1] * m[5]) / d},
                     {(m[5] * m[6] - m[3] * m[8]) / d, (-m[2] * m[6] + m[0] * m[8]) / d, (m[2] * m[3] - m[0] * m[5]) / d},
                     {(-m[4] * m[6] + m[3] * m[7]) / d, (m[1] * m[6] - m[0] * m[7]) / d, (-m[1] * m[3] + m[0] * m[4]) / d}};
    return MatrixFromArray(a->rows, a->columns, new);
  } else if (a->rows == 4) {
    Real new[][4] = {{(-m[7] * m[10] * m[13] + m[6] * m[11] * m[13] + m[7] * m[9] * m[14] - m[5] * m[11] * m[14] - m[6] * m[9] * m[15] + m[5] * m[10] * m[15]) / d,
                      (m[3] * m[10] * m[13] - m[2] * m[11] * m[13] - m[3] * m[9] * m[14] + m[1] * m[11] * m[14] + m[2] * m[9] * m[15] - m[1] * m[10] * m[15]) / d,
                      (-m[3] * m[6] * m[13] + m[2] * m[7] * m[13] + m[3] * m[5] * m[14] - m[1] * m[7] * m[14] - m[2] * m[5] * m[15] + m[1] * m[6] * m[15]) / d,
                      (m[3] * m[6] * m[9] - m[2] * m[7] * m[9] - m[3] * m[5] * m[10] + m[1] * m[7] * m[10] + m[2] * m[5] * m[11] - m[1] * m[6] * m[11]) / d},
                     {(m[7] * m[10] * m[12] - m[6] * m[11] * m[12] - m[7] * m[8] * m[14] + m[4] * m[11] * m[14] + m[6] * m[8] * m[15] - m[4] * m[10] * m[15]) / d,
                      (-m[3] * m[10] * m[12] + m[2] * m[11] * m[12] + m[3] * m[8] * m[14] - m[0] * m[11] * m[14] - m[2] * m[8] * m[15] + m[0] * m[10] * m[15]) / d,
                      (m[3] * m[6] * m[12] - m[2] * m[7] * m[12] - m[3] * m[4] * m[14] + m[0] * m[7] * m[14] + m[2] * m[4] * m[15] - m[0] * m[6] * m[15]) / d,
                      (-m[3] * m[6] * m[8] + m[2] * m[7] * m[8] + m[3] * m[4] * m[10] - m[0] * m[7] * m[10] - m[2] * m[4] * m[11] + m[0] * m[6] * m[11]) / d},
                     {(-m[7] * m[9] * m[12] + m[5] * m[11] * m[12] + m[7] * m[8] * m[13] - m[4] * m[11] * m[13] - m[5] * m[8] * m[15] + m[4] * m[9] * m[15]) / d,
                      (m[3] * m[9] * m[12] - m[1] * m[11] * m[12] - m[3] * m[8] * m[13] + m[0] * m[11] * m[13] + m[1] * m[8] * m[15] - m[0] * m[9] * m[15]) / d,
                      (-m[3] * m[5] * m[12] + m[1] * m[7] * m[12] + m[3] * m[4] * m[13] - m[0] * m[7] * m[13] - m[1] * m[4] * m[15] + m[0] * m[5] * m[15]) / d,
                      (m[3] * m[5] * m[8] - m[1] * m[7] * m[8] - m[3] * m[4] * m[9] + m[0] * m[7] * m[9] + m[1] * m[4] * m[11] - m[0] * m[5] * m[11]) / d},
                     {(m[6] * m[9] * m[12] - m[5] * m[10] * m[12] - m[6] * m[8] * m[13] + m[4] * m[10] * m[13] + m[5] * m[8] * m[14] - m[4] * m[9] * m[14]) / d,
                      (-m[2] * m[9] * m[12] + m[1] * m[10] * m[12] + m[2] * m[8] * m[13] - m[0] * m[10] * m[13] - m[1] * m[8] * m[14] + m[0] * m[9] * m[14]) / d,
                      (m[2] * m[5] * m[12] - m[1] * m[6] * m[12] - m[2] * m[4] * m[13] + m[0] * m[6] * m[13] + m[1] * m[4] * m[14] - m[0] * m[5] * m[14]) / d,
                      (-m[2] * m[5] * m[8] + m[1] * m[6] * m[8] + m[2] * m[4] * m[9] - m[0] * m[6] * m[9] - m[1] * m[4] * m[10] + m[0] * m[5] * m[10]) / d}};
    return MatrixFromArray(a->rows, a->columns, new);
  } else {
    Real new[][5] = {
        {(m[9] * m[13] * m[17] * m[21] - m[8] * m[14] * m[17] * m[21] - m[9] * m[12] * m[18] * m[21] + m[7] * m[14] * m[18] * m[21] + m[8] * m[12] * m[19] * m[21] - m[7] * m[13] * m[19] * m[21] -
          m[9] * m[13] * m[16] * m[22] + m[8] * m[14] * m[16] * m[22] + m[9] * m[11] * m[18] * m[22] - m[6] * m[14] * m[18] * m[22] - m[8] * m[11] * m[19] * m[22] + m[6] * m[13] * m[19] * m[22] +
          m[9] * m[12] * m[16] * m[23] - m[7] * m[14] * m[16] * m[23] - m[9] * m[11] * m[17] * m[23] + m[6] * m[14] * m[17] * m[23] + m[7] * m[11] * m[19] * m[23] - m[6] * m[12] * m[19] * m[23] -
          m[8] * m[12] * m[16] * m[24] + m[7] * m[13] * m[16] * m[24] + m[8] * m[11] * m[17] * m[24] - m[6] * m[13] * m[17] * m[24] - m[7] * m[11] * m[18] * m[24] + m[6] * m[12] * m[18] * m[24]) /
             d,
         (-m[4] * m[13] * m[17] * m[21] + m[3] * m[14] * m[17] * m[21] + m[4] * m[12] * m[18] * m[21] - m[2] * m[14] * m[18] * m[21] - m[3] * m[12] * m[19] * m[21] + m[2] * m[13] * m[19] * m[21] +
          m[4] * m[13] * m[16] * m[22] - m[3] * m[14] * m[16] * m[22] - m[4] * m[11] * m[18] * m[22] + m[1] * m[14] * m[18] * m[22] + m[3] * m[11] * m[19] * m[22] - m[1] * m[13] * m[19] * m[22] -
          m[4] * m[12] * m[16] * m[23] + m[2] * m[14] * m[16] * m[23] + m[4] * m[11] * m[17] * m[23] - m[1] * m[14] * m[17] * m[23] - m[2] * m[11] * m[19] * m[23] + m[1] * m[12] * m[19] * m[23] +
          m[3] * m[12] * m[16] * m[24] - m[2] * m[13] * m[16] * m[24] - m[3] * m[11] * m[17] * m[24] + m[1] * m[13] * m[17] * m[24] + m[2] * m[11] * m[18] * m[24] - m[1] * m[12] * m[18] * m[24]) /
             d,
         (m[4] * m[8] * m[17] * m[21] - m[3] * m[9] * m[17] * m[21] - m[4] * m[7] * m[18] * m[21] + m[2] * m[9] * m[18] * m[21] + m[3] * m[7] * m[19] * m[21] - m[2] * m[8] * m[19] * m[21] -
          m[4] * m[8] * m[16] * m[22] + m[3] * m[9] * m[16] * m[22] + m[4] * m[6] * m[18] * m[22] - m[1] * m[9] * m[18] * m[22] - m[3] * m[6] * m[19] * m[22] + m[1] * m[8] * m[19] * m[22] +
          m[4] * m[7] * m[16] * m[23] - m[2] * m[9] * m[16] * m[23] - m[4] * m[6] * m[17] * m[23] + m[1] * m[9] * m[17] * m[23] + m[2] * m[6] * m[19] * m[23] - m[1] * m[7] * m[19] * m[23] -
          m[3] * m[7] * m[16] * m[24] + m[2] * m[8] * m[16] * m[24] + m[3] * m[6] * m[17] * m[24] - m[1] * m[8] * m[17] * m[24] - m[2] * m[6] * m[18] * m[24] + m[1] * m[7] * m[18] * m[24]) /
             d,
         (-m[4] * m[8] * m[12] * m[21] + m[3] * m[9] * m[12] * m[21] + m[4] * m[7] * m[13] * m[21] - m[2] * m[9] * m[13] * m[21] - m[3] * m[7] * m[14] * m[21] + m[2] * m[8] * m[14] * m[21] +
          m[4] * m[8] * m[11] * m[22] - m[3] * m[9] * m[11] * m[22] - m[4] * m[6] * m[13] * m[22] + m[1] * m[9] * m[13] * m[22] + m[3] * m[6] * m[14] * m[22] - m[1] * m[8] * m[14] * m[22] -
          m[4] * m[7] * m[11] * m[23] + m[2] * m[9] * m[11] * m[23] + m[4] * m[6] * m[12] * m[23] - m[1] * m[9] * m[12] * m[23] - m[2] * m[6] * m[14] * m[23] + m[1] * m[7] * m[14] * m[23] +
          m[3] * m[7] * m[11] * m[24] - m[2] * m[8] * m[11] * m[24] - m[3] * m[6] * m[12] * m[24] + m[1] * m[8] * m[12] * m[24] + m[2] * m[6] * m[13] * m[24] - m[1] * m[7] * m[13] * m[24]) /
             d,
         (m[4] * m[8] * m[12] * m[16] - m[3] * m[9] * m[12] * m[16] - m[4] * m[7] * m[13] * m[16] + m[2] * m[9] * m[13] * m[16] + m[3] * m[7] * m[14] * m[16] - m[2] * m[8] * m[14] * m[16] -
          m[4] * m[8] * m[11] * m[17] + m[3] * m[9] * m[11] * m[17] + m[4] * m[6] * m[13] * m[17] - m[1] * m[9] * m[13] * m[17] - m[3] * m[6] * m[14] * m[17] + m[1] * m[8] * m[14] * m[17] +
          m[4] * m[7] * m[11] * m[18] - m[2] * m[9] * m[11] * m[18] - m[4] * m[6] * m[12] * m[18] + m[1] * m[9] * m[12] * m[18] + m[2] * m[6] * m[14] * m[18] - m[1] * m[7] * m[14] * m[18] -
          m[3] * m[7] * m[11] * m[19] + m[2] * m[8] * m[11] * m[19] + m[3] * m[6] * m[12] * m[19] - m[1] * m[8] * m[12] * m[19] - m[2] * m[6] * m[13] * m[19] + m[1] * m[7] * m[13] * m[19]) /
             d},
        {(-m[9] * m[13] * m[17] * m[20] + m[8] * m[14] * m[17] * m[20] + m[9] * m[12] * m[18] * m[20] - m[7] * m[14] * m[18] * m[20] - m[8] * m[12] * m[19] * m[20] + m[7] * m[13] * m[19] * m[20] +
          m[9] * m[13] * m[15] * m[22] - m[8] * m[14] * m[15] * m[22] - m[9] * m[10] * m[18] * m[22] + m[5] * m[14] * m[18] * m[22] + m[8] * m[10] * m[19] * m[22] - m[5] * m[13] * m[19] * m[22] -
          m[9] * m[12] * m[15] * m[23] + m[7] * m[14] * m[15] * m[23] + m[9] * m[10] * m[17] * m[23] - m[5] * m[14] * m[17] * m[23] - m[7] * m[10] * m[19] * m[23] + m[5] * m[12] * m[19] * m[23] +
          m[8] * m[12] * m[15] * m[24] - m[7] * m[13] * m[15] * m[24] - m[8] * m[10] * m[17] * m[24] + m[5] * m[13] * m[17] * m[24] + m[7] * m[10] * m[18] * m[24] - m[5] * m[12] * m[18] * m[24]) /
             d,
         (m[4] * m[13] * m[17] * m[20] - m[3] * m[14] * m[17] * m[20] - m[4] * m[12] * m[18] * m[20] + m[2] * m[14] * m[18] * m[20] + m[3] * m[12] * m[19] * m[20] - m[2] * m[13] * m[19] * m[20] -
          m[4] * m[13] * m[15] * m[22] + m[3] * m[14] * m[15] * m[22] + m[4] * m[10] * m[18] * m[22] - m[0] * m[14] * m[18] * m[22] - m[3] * m[10] * m[19] * m[22] + m[0] * m[13] * m[19] * m[22] +
          m[4] * m[12] * m[15] * m[23] - m[2] * m[14] * m[15] * m[23] - m[4] * m[10] * m[17] * m[23] + m[0] * m[14] * m[17] * m[23] + m[2] * m[10] * m[19] * m[23] - m[0] * m[12] * m[19] * m[23] -
          m[3] * m[12] * m[15] * m[24] + m[2] * m[13] * m[15] * m[24] + m[3] * m[10] * m[17] * m[24] - m[0] * m[13] * m[17] * m[24] - m[2] * m[10] * m[18] * m[24] + m[0] * m[12] * m[18] * m[24]) /
             d,
         (-m[4] * m[8] * m[17] * m[20] + m[3] * m[9] * m[17] * m[20] + m[4] * m[7] * m[18] * m[20] - m[2] * m[9] * m[18] * m[20] - m[3] * m[7] * m[19] * m[20] + m[2] * m[8] * m[19] * m[20] +
          m[4] * m[8] * m[15] * m[22] - m[3] * m[9] * m[15] * m[22] - m[4] * m[5] * m[18] * m[22] + m[0] * m[9] * m[18] * m[22] + m[3] * m[5] * m[19] * m[22] - m[0] * m[8] * m[19] * m[22] -
          m[4] * m[7] * m[15] * m[23] + m[2] * m[9] * m[15] * m[23] + m[4] * m[5] * m[17] * m[23] - m[0] * m[9] * m[17] * m[23] - m[2] * m[5] * m[19] * m[23] + m[0] * m[7] * m[19] * m[23] +
          m[3] * m[7] * m[15] * m[24] - m[2] * m[8] * m[15] * m[24] - m[3] * m[5] * m[17] * m[24] + m[0] * m[8] * m[17] * m[24] + m[2] * m[5] * m[18] * m[24] - m[0] * m[7] * m[18] * m[24]) /
             d,
         (m[4] * m[8] * m[12] * m[20] - m[3] * m[9] * m[12] * m[20] - m[4] * m[7] * m[13] * m[20] + m[2] * m[9] * m[13] * m[20] + m[3] * m[7] * m[14] * m[20] - m[2] * m[8] * m[14] * m[20] -
          m[4] * m[8] * m[10] * m[22] + m[3] * m[9] * m[10] * m[22] + m[4] * m[5] * m[13] * m[22] - m[0] * m[9] * m[13] * m[22] - m[3] * m[5] * m[14] * m[22] + m[0] * m[8] * m[14] * m[22] +
          m[4] * m[7] * m[10] * m[23] - m[2] * m[9] * m[10] * m[23] - m[4] * m[5] * m[12] * m[23] + m[0] * m[9] * m[12] * m[23] + m[2] * m[5] * m[14] * m[23] - m[0] * m[7] * m[14] * m[23] -
          m[3] * m[7] * m[10] * m[24] + m[2] * m[8] * m[10] * m[24] + m[3] * m[5] * m[12] * m[24] - m[0] * m[8] * m[12] * m[24] - m[2] * m[5] * m[13] * m[24] + m[0] * m[7] * m[13] * m[24]) /
             d,
         (-m[4] * m[8] * m[12] * m[15] + m[3] * m[9] * m[12] * m[15] + m[4] * m[7] * m[13] * m[15] - m[2] * m[9] * m[13] * m[15] - m[3] * m[7] * m[14] * m[15] + m[2] * m[8] * m[14] * m[15] +
          m[4] * m[8] * m[10] * m[17] - m[3] * m[9] * m[10] * m[17] - m[4] * m[5] * m[13] * m[17] + m[0] * m[9] * m[13] * m[17] + m[3] * m[5] * m[14] * m[17] - m[0] * m[8] * m[14] * m[17] -
          m[4] * m[7] * m[10] * m[18] + m[2] * m[9] * m[10] * m[18] + m[4] * m[5] * m[12] * m[18] - m[0] * m[9] * m[12] * m[18] - m[2] * m[5] * m[14] * m[18] + m[0] * m[7] * m[14] * m[18] +
          m[3] * m[7] * m[10] * m[19] - m[2] * m[8] * m[10] * m[19] - m[3] * m[5] * m[12] * m[19] + m[0] * m[8] * m[12] * m[19] + m[2] * m[5] * m[13] * m[19] - m[0] * m[7] * m[13] * m[19]) /
             d},
        {(m[9] * m[13] * m[16] * m[20] - m[8] * m[14] * m[16] * m[20] - m[9] * m[11] * m[18] * m[20] + m[6] * m[14] * m[18] * m[20] + m[8] * m[11] * m[19] * m[20] - m[6] * m[13] * m[19] * m[20] -
          m[9] * m[13] * m[15] * m[21] + m[8] * m[14] * m[15] * m[21] + m[9] * m[10] * m[18] * m[21] - m[5] * m[14] * m[18] * m[21] - m[8] * m[10] * m[19] * m[21] + m[5] * m[13] * m[19] * m[21] +
          m[9] * m[11] * m[15] * m[23] - m[6] * m[14] * m[15] * m[23] - m[9] * m[10] * m[16] * m[23] + m[5] * m[14] * m[16] * m[23] + m[6] * m[10] * m[19] * m[23] - m[5] * m[11] * m[19] * m[23] -
          m[8] * m[11] * m[15] * m[24] + m[6] * m[13] * m[15] * m[24] + m[8] * m[10] * m[16] * m[24] - m[5] * m[13] * m[16] * m[24] - m[6] * m[10] * m[18] * m[24] + m[5] * m[11] * m[18] * m[24]) /
             d,
         (-m[4] * m[13] * m[16] * m[20] + m[3] * m[14] * m[16] * m[20] + m[4] * m[11] * m[18] * m[20] - m[1] * m[14] * m[18] * m[20] - m[3] * m[11] * m[19] * m[20] + m[1] * m[13] * m[19] * m[20] +
          m[4] * m[13] * m[15] * m[21] - m[3] * m[14] * m[15] * m[21] - m[4] * m[10] * m[18] * m[21] + m[0] * m[14] * m[18] * m[21] + m[3] * m[10] * m[19] * m[21] - m[0] * m[13] * m[19] * m[21] -
          m[4] * m[11] * m[15] * m[23] + m[1] * m[14] * m[15] * m[23] + m[4] * m[10] * m[16] * m[23] - m[0] * m[14] * m[16] * m[23] - m[1] * m[10] * m[19] * m[23] + m[0] * m[11] * m[19] * m[23] +
          m[3] * m[11] * m[15] * m[24] - m[1] * m[13] * m[15] * m[24] - m[3] * m[10] * m[16] * m[24] + m[0] * m[13] * m[16] * m[24] + m[1] * m[10] * m[18] * m[24] - m[0] * m[11] * m[18] * m[24]) /
             d,
         (m[4] * m[8] * m[16] * m[20] - m[3] * m[9] * m[16] * m[20] - m[4] * m[6] * m[18] * m[20] + m[1] * m[9] * m[18] * m[20] + m[3] * m[6] * m[19] * m[20] - m[1] * m[8] * m[19] * m[20] -
          m[4] * m[8] * m[15] * m[21] + m[3] * m[9] * m[15] * m[21] + m[4] * m[5] * m[18] * m[21] - m[0] * m[9] * m[18] * m[21] - m[3] * m[5] * m[19] * m[21] + m[0] * m[8] * m[19] * m[21] +
          m[4] * m[6] * m[15] * m[23] - m[1] * m[9] * m[15] * m[23] - m[4] * m[5] * m[16] * m[23] + m[0] * m[9] * m[16] * m[23] + m[1] * m[5] * m[19] * m[23] - m[0] * m[6] * m[19] * m[23] -
          m[3] * m[6] * m[15] * m[24] + m[1] * m[8] * m[15] * m[24] + m[3] * m[5] * m[16] * m[24] - m[0] * m[8] * m[16] * m[24] - m[1] * m[5] * m[18] * m[24] + m[0] * m[6] * m[18] * m[24]) /
             d,
         (-m[4] * m[8] * m[11] * m[20] + m[3] * m[9] * m[11] * m[20] + m[4] * m[6] * m[13] * m[20] - m[1] * m[9] * m[13] * m[20] - m[3] * m[6] * m[14] * m[20] + m[1] * m[8] * m[14] * m[20] +
          m[4] * m[8] * m[10] * m[21] - m[3] * m[9] * m[10] * m[21] - m[4] * m[5] * m[13] * m[21] + m[0] * m[9] * m[13] * m[21] + m[3] * m[5] * m[14] * m[21] - m[0] * m[8] * m[14] * m[21] -
          m[4] * m[6] * m[10] * m[23] + m[1] * m[9] * m[10] * m[23] + m[4] * m[5] * m[11] * m[23] - m[0] * m[9] * m[11] * m[23] - m[1] * m[5] * m[14] * m[23] + m[0] * m[6] * m[14] * m[23] +
          m[3] * m[6] * m[10] * m[24] - m[1] * m[8] * m[10] * m[24] - m[3] * m[5] * m[11] * m[24] + m[0] * m[8] * m[11] * m[24] + m[1] * m[5] * m[13] * m[24] - m[0] * m[6] * m[13] * m[24]) /
             d,
         (m[4] * m[8] * m[11] * m[15] - m[3] * m[9] * m[11] * m[15] - m[4] * m[6] * m[13] * m[15] + m[1] * m[9] * m[13] * m[15] + m[3] * m[6] * m[14] * m[15] - m[1] * m[8] * m[14] * m[15] -
          m[4] * m[8] * m[10] * m[16] + m[3] * m[9] * m[10] * m[16] + m[4] * m[5] * m[13] * m[16] - m[0] * m[9] * m[13] * m[16] - m[3] * m[5] * m[14] * m[16] + m[0] * m[8] * m[14] * m[16] +
          m[4] * m[6] * m[10] * m[18] - m[1] * m[9] * m[10] * m[18] - m[4] * m[5] * m[11] * m[18] + m[0] * m[9] * m[11] * m[18] + m[1] * m[5] * m[14] * m[18] - m[0] * m[6] * m[14] * m[18] -
          m[3] * m[6] * m[10] * m[19] + m[1] * m[8] * m[10] * m[19] + m[3] * m[5] * m[11] * m[19] - m[0] * m[8] * m[11] * m[19] - m[1] * m[5] * m[13] * m[19] + m[0] * m[6] * m[13] * m[19]) /
             d},
        {(-m[9] * m[12] * m[16] * m[20] + m[7] * m[14] * m[16] * m[20] + m[9] * m[11] * m[17] * m[20] - m[6] * m[14] * m[17] * m[20] - m[7] * m[11] * m[19] * m[20] + m[6] * m[12] * m[19] * m[20] +
          m[9] * m[12] * m[15] * m[21] - m[7] * m[14] * m[15] * m[21] - m[9] * m[10] * m[17] * m[21] + m[5] * m[14] * m[17] * m[21] + m[7] * m[10] * m[19] * m[21] - m[5] * m[12] * m[19] * m[21] -
          m[9] * m[11] * m[15] * m[22] + m[6] * m[14] * m[15] * m[22] + m[9] * m[10] * m[16] * m[22] - m[5] * m[14] * m[16] * m[22] - m[6] * m[10] * m[19] * m[22] + m[5] * m[11] * m[19] * m[22] +
          m[7] * m[11] * m[15] * m[24] - m[6] * m[12] * m[15] * m[24] - m[7] * m[10] * m[16] * m[24] + m[5] * m[12] * m[16] * m[24] + m[6] * m[10] * m[17] * m[24] - m[5] * m[11] * m[17] * m[24]) /
             d,
         (m[4] * m[12] * m[16] * m[20] - m[2] * m[14] * m[16] * m[20] - m[4] * m[11] * m[17] * m[20] + m[1] * m[14] * m[17] * m[20] + m[2] * m[11] * m[19] * m[20] - m[1] * m[12] * m[19] * m[20] -
          m[4] * m[12] * m[15] * m[21] + m[2] * m[14] * m[15] * m[21] + m[4] * m[10] * m[17] * m[21] - m[0] * m[14] * m[17] * m[21] - m[2] * m[10] * m[19] * m[21] + m[0] * m[12] * m[19] * m[21] +
          m[4] * m[11] * m[15] * m[22] - m[1] * m[14] * m[15] * m[22] - m[4] * m[10] * m[16] * m[22] + m[0] * m[14] * m[16] * m[22] + m[1] * m[10] * m[19] * m[22] - m[0] * m[11] * m[19] * m[22] -
          m[2] * m[11] * m[15] * m[24] + m[1] * m[12] * m[15] * m[24] + m[2] * m[10] * m[16] * m[24] - m[0] * m[12] * m[16] * m[24] - m[1] * m[10] * m[17] * m[24] + m[0] * m[11] * m[17] * m[24]) /
             d,
         (-m[4] * m[7] * m[16] * m[20] + m[2] * m[9] * m[16] * m[20] + m[4] * m[6] * m[17] * m[20] - m[1] * m[9] * m[17] * m[20] - m[2] * m[6] * m[19] * m[20] + m[1] * m[7] * m[19] * m[20] +
          m[4] * m[7] * m[15] * m[21] - m[2] * m[9] * m[15] * m[21] - m[4] * m[5] * m[17] * m[21] + m[0] * m[9] * m[17] * m[21] + m[2] * m[5] * m[19] * m[21] - m[0] * m[7] * m[19] * m[21] -
          m[4] * m[6] * m[15] * m[22] + m[1] * m[9] * m[15] * m[22] + m[4] * m[5] * m[16] * m[22] - m[0] * m[9] * m[16] * m[22] - m[1] * m[5] * m[19] * m[22] + m[0] * m[6] * m[19] * m[22] +
          m[2] * m[6] * m[15] * m[24] - m[1] * m[7] * m[15] * m[24] - m[2] * m[5] * m[16] * m[24] + m[0] * m[7] * m[16] * m[24] + m[1] * m[5] * m[17] * m[24] - m[0] * m[6] * m[17] * m[24]) /
             d,
         (m[4] * m[7] * m[11] * m[20] - m[2] * m[9] * m[11] * m[20] - m[4] * m[6] * m[12] * m[20] + m[1] * m[9] * m[12] * m[20] + m[2] * m[6] * m[14] * m[20] - m[1] * m[7] * m[14] * m[20] -
          m[4] * m[7] * m[10] * m[21] + m[2] * m[9] * m[10] * m[21] + m[4] * m[5] * m[12] * m[21] - m[0] * m[9] * m[12] * m[21] - m[2] * m[5] * m[14] * m[21] + m[0] * m[7] * m[14] * m[21] +
          m[4] * m[6] * m[10] * m[22] - m[1] * m[9] * m[10] * m[22] - m[4] * m[5] * m[11] * m[22] + m[0] * m[9] * m[11] * m[22] + m[1] * m[5] * m[14] * m[22] - m[0] * m[6] * m[14] * m[22] -
          m[2] * m[6] * m[10] * m[24] + m[1] * m[7] * m[10] * m[24] + m[2] * m[5] * m[11] * m[24] - m[0] * m[7] * m[11] * m[24] - m[1] * m[5] * m[12] * m[24] + m[0] * m[6] * m[12] * m[24]) /
             d,
         (-m[4] * m[7] * m[11] * m[15] + m[2] * m[9] * m[11] * m[15] + m[4] * m[6] * m[12] * m[15] - m[1] * m[9] * m[12] * m[15] - m[2] * m[6] * m[14] * m[15] + m[1] * m[7] * m[14] * m[15] +
          m[4] * m[7] * m[10] * m[16] - m[2] * m[9] * m[10] * m[16] - m[4] * m[5] * m[12] * m[16] + m[0] * m[9] * m[12] * m[16] + m[2] * m[5] * m[14] * m[16] - m[0] * m[7] * m[14] * m[16] -
          m[4] * m[6] * m[10] * m[17] + m[1] * m[9] * m[10] * m[17] + m[4] * m[5] * m[11] * m[17] - m[0] * m[9] * m[11] * m[17] - m[1] * m[5] * m[14] * m[17] + m[0] * m[6] * m[14] * m[17] +
          m[2] * m[6] * m[10] * m[19] - m[1] * m[7] * m[10] * m[19] - m[2] * m[5] * m[11] * m[19] + m[0] * m[7] * m[11] * m[19] + m[1] * m[5] * m[12] * m[19] - m[0] * m[6] * m[12] * m[19]) /
             d},
        {(m[8] * m[12] * m[16] * m[20] - m[7] * m[13] * m[16] * m[20] - m[8] * m[11] * m[17] * m[20] + m[6] * m[13] * m[17] * m[20] + m[7] * m[11] * m[18] * m[20] - m[6] * m[12] * m[18] * m[20] -
          m[8] * m[12] * m[15] * m[21] + m[7] * m[13] * m[15] * m[21] + m[8] * m[10] * m[17] * m[21] - m[5] * m[13] * m[17] * m[21] - m[7] * m[10] * m[18] * m[21] + m[5] * m[12] * m[18] * m[21] +
          m[8] * m[11] * m[15] * m[22] - m[6] * m[13] * m[15] * m[22] - m[8] * m[10] * m[16] * m[22] + m[5] * m[13] * m[16] * m[22] + m[6] * m[10] * m[18] * m[22] - m[5] * m[11] * m[18] * m[22] -
          m[7] * m[11] * m[15] * m[23] + m[6] * m[12] * m[15] * m[23] + m[7] * m[10] * m[16] * m[23] - m[5] * m[12] * m[16] * m[23] - m[6] * m[10] * m[17] * m[23] + m[5] * m[11] * m[17] * m[23]) /
             d,
         (-m[3] * m[12] * m[16] * m[20] + m[2] * m[13] * m[16] * m[20] + m[3] * m[11] * m[17] * m[20] - m[1] * m[13] * m[17] * m[20] - m[2] * m[11] * m[18] * m[20] + m[1] * m[12] * m[18] * m[20] +
          m[3] * m[12] * m[15] * m[21] - m[2] * m[13] * m[15] * m[21] - m[3] * m[10] * m[17] * m[21] + m[0] * m[13] * m[17] * m[21] + m[2] * m[10] * m[18] * m[21] - m[0] * m[12] * m[18] * m[21] -
          m[3] * m[11] * m[15] * m[22] + m[1] * m[13] * m[15] * m[22] + m[3] * m[10] * m[16] * m[22] - m[0] * m[13] * m[16] * m[22] - m[1] * m[10] * m[18] * m[22] + m[0] * m[11] * m[18] * m[22] +
          m[2] * m[11] * m[15] * m[23] - m[1] * m[12] * m[15] * m[23] - m[2] * m[10] * m[16] * m[23] + m[0] * m[12] * m[16] * m[23] + m[1] * m[10] * m[17] * m[23] - m[0] * m[11] * m[17] * m[23]) /
             d,
         (m[3] * m[7] * m[16] * m[20] - m[2] * m[8] * m[16] * m[20] - m[3] * m[6] * m[17] * m[20] + m[1] * m[8] * m[17] * m[20] + m[2] * m[6] * m[18] * m[20] - m[1] * m[7] * m[18] * m[20] -
          m[3] * m[7] * m[15] * m[21] + m[2] * m[8] * m[15] * m[21] + m[3] * m[5] * m[17] * m[21] - m[0] * m[8] * m[17] * m[21] - m[2] * m[5] * m[18] * m[21] + m[0] * m[7] * m[18] * m[21] +
          m[3] * m[6] * m[15] * m[22] - m[1] * m[8] * m[15] * m[22] - m[3] * m[5] * m[16] * m[22] + m[0] * m[8] * m[16] * m[22] + m[1] * m[5] * m[18] * m[22] - m[0] * m[6] * m[18] * m[22] -
          m[2] * m[6] * m[15] * m[23] + m[1] * m[7] * m[15] * m[23] + m[2] * m[5] * m[16] * m[23] - m[0] * m[7] * m[16] * m[23] - m[1] * m[5] * m[17] * m[23] + m[0] * m[6] * m[17] * m[23]) /
             d,
         (-m[3] * m[7] * m[11] * m[20] + m[2] * m[8] * m[11] * m[20] + m[3] * m[6] * m[12] * m[20] - m[1] * m[8] * m[12] * m[20] - m[2] * m[6] * m[13] * m[20] + m[1] * m[7] * m[13] * m[20] +
          m[3] * m[7] * m[10] * m[21] - m[2] * m[8] * m[10] * m[21] - m[3] * m[5] * m[12] * m[21] + m[0] * m[8] * m[12] * m[21] + m[2] * m[5] * m[13] * m[21] - m[0] * m[7] * m[13] * m[21] -
          m[3] * m[6] * m[10] * m[22] + m[1] * m[8] * m[10] * m[22] + m[3] * m[5] * m[11] * m[22] - m[0] * m[8] * m[11] * m[22] - m[1] * m[5] * m[13] * m[22] + m[0] * m[6] * m[13] * m[22] +
          m[2] * m[6] * m[10] * m[23] - m[1] * m[7] * m[10] * m[23] - m[2] * m[5] * m[11] * m[23] + m[0] * m[7] * m[11] * m[23] + m[1] * m[5] * m[12] * m[23] - m[0] * m[6] * m[12] * m[23]) /
             d,
         (m[3] * m[7] * m[11] * m[15] - m[2] * m[8] * m[11] * m[15] - m[3] * m[6] * m[12] * m[15] + m[1] * m[8] * m[12] * m[15] + m[2] * m[6] * m[13] * m[15] - m[1] * m[7] * m[13] * m[15] -
          m[3] * m[7] * m[10] * m[16] + m[2] * m[8] * m[10] * m[16] + m[3] * m[5] * m[12] * m[16] - m[0] * m[8] * m[12] * m[16] - m[2] * m[5] * m[13] * m[16] + m[0] * m[7] * m[13] * m[16] +
          m[3] * m[6] * m[10] * m[17] - m[1] * m[8] * m[10] * m[17] - m[3] * m[5] * m[11] * m[17] + m[0] * m[8] * m[11] * m[17] + m[1] * m[5] * m[13] * m[17] - m[0] * m[6] * m[13] * m[17] -
          m[2] * m[6] * m[10] * m[18] + m[1] * m[7] * m[10] * m[18] + m[2] * m[5] * m[11] * m[18] - m[0] * m[7] * m[11] * m[18] - m[1] * m[5] * m[12] * m[18] + m[0] * m[6] * m[12] * m[18]) /
             d}};
    return MatrixFromArray(a->rows, a->columns, new);
  }
}